

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  int in_EDI;
  double dtime;
  int cycle;
  FmsInt order;
  int dims [3];
  char filename [100];
  char *protocol;
  int nts;
  int timestep;
  undefined4 in_stack_000000b4;
  int in_stack_000000bc;
  FmsInt in_stack_000000c0;
  int *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  char local_88 [104];
  char *local_20;
  int local_18;
  uint local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 1;
  local_20 = "ascii";
  if ((1 < in_EDI) && (local_20 = *(char **)(in_RSI + 8), 2 < in_EDI)) {
    local_10 = in_RSI;
    local_8 = in_EDI;
    iVar1 = atoi(*(char **)(in_RSI + 0x10));
    if (iVar1 == 0) {
      return -1;
    }
    if (5 < local_8) {
      iVar1 = atoi(*(char **)(local_10 + 0x18));
      iVar2 = atoi(*(char **)(local_10 + 0x20));
      iVar3 = atoi(*(char **)(local_10 + 0x28));
      if (((iVar1 < 2) || (iVar2 < 2)) || (iVar3 < 2)) {
        return -2;
      }
      if (6 < local_8) {
        local_18 = atoi(*(char **)(local_10 + 0x30));
      }
    }
  }
  for (local_14 = 0; (int)local_14 < local_18; local_14 = local_14 + 1) {
    if (local_18 < 2) {
      strcpy(local_88,"hex.fms");
    }
    else {
      sprintf(local_88,"hex%04d.fms",(ulong)local_14);
    }
    WriteTimeStep(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                  in_stack_000000bc,(double)CONCAT44(in_stack_000000b4,argc));
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
  int timestep = 0, nts = 1;
  const char *protocol = "ascii";
  char filename[100];
  int dims[3] = {3,3,3};
  FmsInt order = 1;

  /* Handle some command line args. */
  if(argc > 1) {
    protocol = argv[1];
    if(argc > 2) {
      order = atoi(argv[2]);
      if(order < 1)
        return -1;
      if(argc >= 6) {
        dims[0] = atoi(argv[3]);
        dims[1] = atoi(argv[4]);
        dims[2] = atoi(argv[5]);
        if(dims[0] < 2 || dims[1] < 2 || dims[2] < 2)
          return -2;
        if(argc >= 7)
          nts = atoi(argv[6]);
      }
    }
  }

  for(timestep = 0; timestep < nts; timestep++) {
    int cycle  = 1234 + 1000*timestep;
    double dtime = 1.2345678 + timestep;
    if(nts > 1)
      sprintf(filename, "hex%04d.fms", timestep);
    else
      strcpy(filename, "hex.fms");

    WriteTimeStep(filename, protocol, dims, order, cycle, dtime);
  }

  return 0;
}